

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# solvereal.hpp
# Opt level: O3

void __thiscall
soplex::
SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
::_verifySolutionReal
          (SoPlexBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
           *this)

{
  Verbosity VVar1;
  ostream *poVar2;
  Real RVar3;
  char cVar4;
  int iVar5;
  Verbosity old_verbosity;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  redcostviol;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  dualviol;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  rowviol;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  boundviol;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  sumviol;
  cpp_dec_float<100U,_int,_void> local_358;
  cpp_dec_float<100U,_int,_void> local_308;
  cpp_dec_float<100U,_int,_void> local_2b8;
  cpp_dec_float<100U,_int,_void> local_268;
  cpp_dec_float<100U,_int,_void> local_218;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_1c8;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_178;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_128;
  number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
  local_d8;
  cpp_dec_float<100U,_int,_void> local_80;
  
  VVar1 = (this->spxout).m_verbosity;
  if (2 < (int)VVar1) {
    (this->spxout).m_verbosity = INFO1;
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[3]," --- verifying computed solution",0x20);
    poVar2 = (this->spxout).m_streams[(this->spxout).m_verbosity];
    cVar4 = (char)poVar2;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + cVar4);
    std::ostream::put(cVar4);
    std::ostream::flush();
    (this->spxout).m_verbosity = VVar1;
  }
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (&local_80,0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (&local_268,0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (&local_2b8,0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (&local_308,0,(type *)0x0);
  boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::cpp_dec_float<long_long>
            (&local_358,0,(type *)0x0);
  getBoundViolation(this,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                          *)&local_268,
                    (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                     *)&local_80);
  getRowViolation(this,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                        *)&local_2b8,
                  (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                   *)&local_80);
  getDualViolation(this,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                         *)&local_308,
                   (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                    *)&local_80);
  getRedCostViolation(this,(number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                            *)&local_358,
                      (number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>
                       *)&local_80);
  RVar3 = Tolerances::floatingPointFeastol
                    ((this->_solver).
                     super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                     ._tolerances.super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>
                     ._M_ptr);
  if ((NAN(RVar3)) || (local_268.fpclass == cpp_dec_float_NaN)) {
LAB_0049aa67:
    RVar3 = Tolerances::floatingPointFeastol
                      ((this->_solver).
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ._tolerances.
                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if ((!NAN(RVar3)) && (local_2b8.fpclass != cpp_dec_float_NaN)) {
      local_218.fpclass = cpp_dec_float_finite;
      local_218.prec_elem = 0x10;
      local_218.data._M_elems[0] = 0;
      local_218.data._M_elems[1] = 0;
      local_218.data._M_elems[2] = 0;
      local_218.data._M_elems[3] = 0;
      local_218.data._M_elems[4] = 0;
      local_218.data._M_elems[5] = 0;
      local_218.data._M_elems[6] = 0;
      local_218.data._M_elems[7] = 0;
      local_218.data._M_elems[8] = 0;
      local_218.data._M_elems[9] = 0;
      local_218.data._M_elems[10] = 0;
      local_218.data._M_elems[0xb] = 0;
      local_218.data._M_elems[0xc] = 0;
      local_218.data._M_elems[0xd] = 0;
      local_218.data._M_elems._56_5_ = 0;
      local_218.data._M_elems[0xf]._1_3_ = 0;
      local_218.exp = 0;
      local_218.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_218,RVar3);
      iVar5 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                        (&local_2b8,&local_218);
      if (-1 < iVar5) goto LAB_0049abb0;
    }
    RVar3 = Tolerances::floatingPointOpttol
                      ((this->_solver).
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ._tolerances.
                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if ((!NAN(RVar3)) && (local_308.fpclass != cpp_dec_float_NaN)) {
      local_218.fpclass = cpp_dec_float_finite;
      local_218.prec_elem = 0x10;
      local_218.data._M_elems[0] = 0;
      local_218.data._M_elems[1] = 0;
      local_218.data._M_elems[2] = 0;
      local_218.data._M_elems[3] = 0;
      local_218.data._M_elems[4] = 0;
      local_218.data._M_elems[5] = 0;
      local_218.data._M_elems[6] = 0;
      local_218.data._M_elems[7] = 0;
      local_218.data._M_elems[8] = 0;
      local_218.data._M_elems[9] = 0;
      local_218.data._M_elems[10] = 0;
      local_218.data._M_elems[0xb] = 0;
      local_218.data._M_elems[0xc] = 0;
      local_218.data._M_elems[0xd] = 0;
      local_218.data._M_elems._56_5_ = 0;
      local_218.data._M_elems[0xf]._1_3_ = 0;
      local_218.exp = 0;
      local_218.neg = false;
      boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
                ((cpp_dec_float<100u,int,void> *)&local_218,RVar3);
      iVar5 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                        (&local_308,&local_218);
      if (-1 < iVar5) goto LAB_0049abb0;
    }
    RVar3 = Tolerances::floatingPointOpttol
                      ((this->_solver).
                       super_SPxLPBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
                       ._tolerances.
                       super___shared_ptr<soplex::Tolerances,_(__gnu_cxx::_Lock_policy)2>._M_ptr);
    if (NAN(RVar3)) {
      return;
    }
    if (local_358.fpclass == cpp_dec_float_NaN) {
      return;
    }
    local_218.fpclass = cpp_dec_float_finite;
    local_218.prec_elem = 0x10;
    local_218.data._M_elems[0] = 0;
    local_218.data._M_elems[1] = 0;
    local_218.data._M_elems[2] = 0;
    local_218.data._M_elems[3] = 0;
    local_218.data._M_elems[4] = 0;
    local_218.data._M_elems[5] = 0;
    local_218.data._M_elems[6] = 0;
    local_218.data._M_elems[7] = 0;
    local_218.data._M_elems[8] = 0;
    local_218.data._M_elems[9] = 0;
    local_218.data._M_elems[10] = 0;
    local_218.data._M_elems[0xb] = 0;
    local_218.data._M_elems[0xc] = 0;
    local_218.data._M_elems[0xd] = 0;
    local_218.data._M_elems._56_5_ = 0;
    local_218.data._M_elems[0xf]._1_3_ = 0;
    local_218.exp = 0;
    local_218.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_218,RVar3);
    iVar5 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                      (&local_358,&local_218);
    if (iVar5 < 0) {
      return;
    }
  }
  else {
    local_218.fpclass = cpp_dec_float_finite;
    local_218.prec_elem = 0x10;
    local_218.data._M_elems[0] = 0;
    local_218.data._M_elems[1] = 0;
    local_218.data._M_elems[2] = 0;
    local_218.data._M_elems[3] = 0;
    local_218.data._M_elems[4] = 0;
    local_218.data._M_elems[5] = 0;
    local_218.data._M_elems[6] = 0;
    local_218.data._M_elems[7] = 0;
    local_218.data._M_elems[8] = 0;
    local_218.data._M_elems[9] = 0;
    local_218.data._M_elems[10] = 0;
    local_218.data._M_elems[0xb] = 0;
    local_218.data._M_elems[0xc] = 0;
    local_218.data._M_elems[0xd] = 0;
    local_218.data._M_elems._56_5_ = 0;
    local_218.data._M_elems[0xf]._1_3_ = 0;
    local_218.exp = 0;
    local_218.neg = false;
    boost::multiprecision::backends::cpp_dec_float<100u,int,void>::operator=
              ((cpp_dec_float<100u,int,void> *)&local_218,RVar3);
    iVar5 = boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>::compare
                      (&local_268,&local_218);
    if (iVar5 < 0) goto LAB_0049aa67;
  }
LAB_0049abb0:
  VVar1 = (this->spxout).m_verbosity;
  if ((int)VVar1 < 5) {
    if ((int)VVar1 < 3) goto LAB_0049ae3d;
  }
  else {
    (this->spxout).m_verbosity = INFO3;
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[5],"bound violation: ",0x11);
    local_d8.m_backend.data._M_elems[0] = local_268.data._M_elems[0];
    local_d8.m_backend.data._M_elems[1] = local_268.data._M_elems[1];
    local_d8.m_backend.data._M_elems[2] = local_268.data._M_elems[2];
    local_d8.m_backend.data._M_elems[3] = local_268.data._M_elems[3];
    local_d8.m_backend.data._M_elems[4] = local_268.data._M_elems[4];
    local_d8.m_backend.data._M_elems[5] = local_268.data._M_elems[5];
    local_d8.m_backend.data._M_elems[6] = local_268.data._M_elems[6];
    local_d8.m_backend.data._M_elems[7] = local_268.data._M_elems[7];
    local_d8.m_backend.data._M_elems[8] = local_268.data._M_elems[8];
    local_d8.m_backend.data._M_elems[9] = local_268.data._M_elems[9];
    local_d8.m_backend.data._M_elems[10] = local_268.data._M_elems[10];
    local_d8.m_backend.data._M_elems[0xb] = local_268.data._M_elems[0xb];
    local_d8.m_backend.data._M_elems[0xc] = local_268.data._M_elems[0xc];
    local_d8.m_backend.data._M_elems[0xd] = local_268.data._M_elems[0xd];
    local_d8.m_backend.data._M_elems[0xe] = local_268.data._M_elems[0xe];
    local_d8.m_backend.data._M_elems[0xf] = local_268.data._M_elems[0xf];
    local_d8.m_backend.exp = local_268.exp;
    local_d8.m_backend.neg = local_268.neg;
    boost::multiprecision::operator<<
              ((this->spxout).m_streams[(this->spxout).m_verbosity],&local_d8);
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[(this->spxout).m_verbosity],", row violation: ",0x11);
    local_128.m_backend.data._M_elems[0] = local_2b8.data._M_elems[0];
    local_128.m_backend.data._M_elems[1] = local_2b8.data._M_elems[1];
    local_128.m_backend.data._M_elems[2] = local_2b8.data._M_elems[2];
    local_128.m_backend.data._M_elems[3] = local_2b8.data._M_elems[3];
    local_128.m_backend.data._M_elems[4] = local_2b8.data._M_elems[4];
    local_128.m_backend.data._M_elems[5] = local_2b8.data._M_elems[5];
    local_128.m_backend.data._M_elems[6] = local_2b8.data._M_elems[6];
    local_128.m_backend.data._M_elems[7] = local_2b8.data._M_elems[7];
    local_128.m_backend.data._M_elems[8] = local_2b8.data._M_elems[8];
    local_128.m_backend.data._M_elems[9] = local_2b8.data._M_elems[9];
    local_128.m_backend.data._M_elems[10] = local_2b8.data._M_elems[10];
    local_128.m_backend.data._M_elems[0xb] = local_2b8.data._M_elems[0xb];
    local_128.m_backend.data._M_elems[0xc] = local_2b8.data._M_elems[0xc];
    local_128.m_backend.data._M_elems[0xd] = local_2b8.data._M_elems[0xd];
    local_128.m_backend.data._M_elems[0xe] = local_2b8.data._M_elems[0xe];
    local_128.m_backend.data._M_elems[0xf] = local_2b8.data._M_elems[0xf];
    local_128.m_backend.exp = local_2b8.exp;
    local_128.m_backend.neg = local_2b8.neg;
    boost::multiprecision::operator<<
              ((this->spxout).m_streams[(this->spxout).m_verbosity],&local_128);
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[(this->spxout).m_verbosity],", dual violation: ",0x12);
    local_178.m_backend.data._M_elems[0] = local_308.data._M_elems[0];
    local_178.m_backend.data._M_elems[1] = local_308.data._M_elems[1];
    local_178.m_backend.data._M_elems[2] = local_308.data._M_elems[2];
    local_178.m_backend.data._M_elems[3] = local_308.data._M_elems[3];
    local_178.m_backend.data._M_elems[4] = local_308.data._M_elems[4];
    local_178.m_backend.data._M_elems[5] = local_308.data._M_elems[5];
    local_178.m_backend.data._M_elems[6] = local_308.data._M_elems[6];
    local_178.m_backend.data._M_elems[7] = local_308.data._M_elems[7];
    local_178.m_backend.data._M_elems[8] = local_308.data._M_elems[8];
    local_178.m_backend.data._M_elems[9] = local_308.data._M_elems[9];
    local_178.m_backend.data._M_elems[10] = local_308.data._M_elems[10];
    local_178.m_backend.data._M_elems[0xb] = local_308.data._M_elems[0xb];
    local_178.m_backend.data._M_elems[0xc] = local_308.data._M_elems[0xc];
    local_178.m_backend.data._M_elems[0xd] = local_308.data._M_elems[0xd];
    local_178.m_backend.data._M_elems[0xe] = local_308.data._M_elems[0xe];
    local_178.m_backend.data._M_elems[0xf] = local_308.data._M_elems[0xf];
    local_178.m_backend.exp = local_308.exp;
    local_178.m_backend.neg = local_308.neg;
    boost::multiprecision::operator<<
              ((this->spxout).m_streams[(this->spxout).m_verbosity],&local_178);
    std::__ostream_insert<char,std::char_traits<char>>
              ((this->spxout).m_streams[(this->spxout).m_verbosity],", redcost violation: ",0x15);
    local_1c8.m_backend.data._M_elems[0] = local_358.data._M_elems[0];
    local_1c8.m_backend.data._M_elems[1] = local_358.data._M_elems[1];
    local_1c8.m_backend.data._M_elems[2] = local_358.data._M_elems[2];
    local_1c8.m_backend.data._M_elems[3] = local_358.data._M_elems[3];
    local_1c8.m_backend.data._M_elems[4] = local_358.data._M_elems[4];
    local_1c8.m_backend.data._M_elems[5] = local_358.data._M_elems[5];
    local_1c8.m_backend.data._M_elems[6] = local_358.data._M_elems[6];
    local_1c8.m_backend.data._M_elems[7] = local_358.data._M_elems[7];
    local_1c8.m_backend.data._M_elems[8] = local_358.data._M_elems[8];
    local_1c8.m_backend.data._M_elems[9] = local_358.data._M_elems[9];
    local_1c8.m_backend.data._M_elems[10] = local_358.data._M_elems[10];
    local_1c8.m_backend.data._M_elems[0xb] = local_358.data._M_elems[0xb];
    local_1c8.m_backend.data._M_elems[0xc] = local_358.data._M_elems[0xc];
    local_1c8.m_backend.data._M_elems[0xd] = local_358.data._M_elems[0xd];
    local_1c8.m_backend.data._M_elems[0xe] = local_358.data._M_elems[0xe];
    local_1c8.m_backend.data._M_elems[0xf] = local_358.data._M_elems[0xf];
    local_1c8.m_backend.exp = local_358.exp;
    local_1c8.m_backend.neg = local_358.neg;
    boost::multiprecision::operator<<
              ((this->spxout).m_streams[(this->spxout).m_verbosity],&local_1c8);
    poVar2 = (this->spxout).m_streams[(this->spxout).m_verbosity];
    cVar4 = (char)poVar2;
    std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + cVar4);
    std::ostream::put(cVar4);
    std::ostream::flush();
  }
  (this->spxout).m_verbosity = INFO1;
  std::__ostream_insert<char,std::char_traits<char>>
            ((this->spxout).m_streams[3],
             " --- detected violations in original problem space -- solve again without presolving/scaling"
             ,0x5c);
  poVar2 = (this->spxout).m_streams[(this->spxout).m_verbosity];
  cVar4 = (char)poVar2;
  std::ios::widen((char)*(undefined8 *)(*(long *)poVar2 + -0x18) + cVar4);
  std::ostream::put(cVar4);
  std::ostream::flush();
  (this->spxout).m_verbosity = VVar1;
LAB_0049ae3d:
  if (this->_isRealLPScaled == true) {
    SPxSolverBase<boost::multiprecision::number<boost::multiprecision::backends::cpp_dec_float<100U,_int,_void>,_(boost::multiprecision::expression_template_option)0>_>
    ::unscaleLPandReloadBasis(&this->_solver);
    this->_isRealLPScaled = false;
    this->_unscaleCalls = this->_unscaleCalls + 1;
  }
  _preprocessAndSolveReal(this,false,(bool *)0x0);
  return;
}

Assistant:

void SoPlexBase<R>::_verifySolutionReal()
{
   assert(_hasSolReal);

   SPX_MSG_INFO1(spxout, spxout << " --- verifying computed solution" << std::endl;)

   R sumviol = 0;
   R boundviol = 0;
   R rowviol = 0;
   R dualviol = 0;
   R redcostviol = 0;

   (void) getBoundViolation(boundviol, sumviol);
   (void) getRowViolation(rowviol, sumviol);
   (void) getDualViolation(dualviol, sumviol);
   (void) getRedCostViolation(redcostviol, sumviol);

   if(boundviol >= _solver.tolerances()->floatingPointFeastol()
         || rowviol >= _solver.tolerances()->floatingPointFeastol()
         || dualviol >= _solver.tolerances()->floatingPointOpttol()
         || redcostviol >= _solver.tolerances()->floatingPointOpttol())
   {
      assert(&_solver == _realLP);
      assert(_isRealLPLoaded);
      SPX_MSG_INFO3(spxout, spxout << "bound violation: " << boundviol
                    << ", row violation: " << rowviol
                    << ", dual violation: " << dualviol
                    << ", redcost violation: " << redcostviol << std::endl;)
      SPX_MSG_INFO1(spxout, spxout <<
                    " --- detected violations in original problem space -- solve again without presolving/scaling" <<
                    std::endl;)

      if(_isRealLPScaled)
      {
         _solver.unscaleLPandReloadBasis();
         _isRealLPScaled = false;
         ++_unscaleCalls;
      }

      _preprocessAndSolveReal(false);
   }
}